

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-hang-loop.c
# Opt level: O2

int run_test_udp_send_hang_loop(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_idle_init(uVar2,&idle_handle);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr("192.0.2.3",0x23a3,&addr);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_udp_init(uVar2,&client);
      if (iVar1 == 0) {
        buf = (uv_buf_t)uv_buf_init(send_data,0x400);
        iVar1 = uv_idle_start(&idle_handle,idle_cb);
        if (iVar1 == 0) {
          uVar2 = uv_default_loop();
          uv_run(uVar2,0);
          if (loop_hang_called < 0x3e9) {
            pcVar3 = "loop_hang_called > 1000";
            uStack_10 = 0x5f;
          }
          else {
            uVar2 = uv_default_loop();
            uv_walk(uVar2,close_walk_cb,0);
            uv_run(uVar2,0);
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            if (iVar1 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uStack_10 = 0x61;
          }
        }
        else {
          pcVar3 = "0 == uv_idle_start(&idle_handle, idle_cb)";
          uStack_10 = 0x5b;
        }
      }
      else {
        pcVar3 = "0 == uv_udp_init(uv_default_loop(), &client)";
        uStack_10 = 0x57;
      }
    }
    else {
      pcVar3 = "0 == uv_ip4_addr(\"192.0.2.3\", TEST_PORT, &addr)";
      uStack_10 = 0x55;
    }
  }
  else {
    pcVar3 = "0 == uv_idle_init(uv_default_loop(), &idle_handle)";
    uStack_10 = 0x50;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-hang-loop.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_send_hang_loop) {
  ASSERT(0 == uv_idle_init(uv_default_loop(), &idle_handle));

  /* 192.0.2.0/8 is "TEST-NET" and reserved for documentation.
   * Good for us, though. Since we want to have something unreachable.
   */
  ASSERT(0 == uv_ip4_addr("192.0.2.3", TEST_PORT, &addr));

  ASSERT(0 == uv_udp_init(uv_default_loop(), &client));

  buf = uv_buf_init(send_data, sizeof(send_data));

  ASSERT(0 == uv_idle_start(&idle_handle, idle_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(loop_hang_called > 1000);

  MAKE_VALGRIND_HAPPY();
  return 0;
}